

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

int __thiscall cmCTestLaunch::Run(cmCTestLaunch *this)

{
  bool bVar1;
  int iVar2;
  
  if (this->Process == (cmsysProcess_s *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not allocate cmsysProcess instance!\n",0x2a);
    iVar2 = -1;
  }
  else {
    RunChild(this);
    bVar1 = CheckResults(this);
    if (!bVar1) {
      LoadConfig(this);
      WriteXML(this);
    }
    iVar2 = this->ExitCode;
  }
  return iVar2;
}

Assistant:

int cmCTestLaunch::Run()
{
  if (!this->Process) {
    std::cerr << "Could not allocate cmsysProcess instance!\n";
    return -1;
  }

  this->RunChild();

  if (this->CheckResults()) {
    return this->ExitCode;
  }

  this->LoadConfig();
  this->WriteXML();

  return this->ExitCode;
}